

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Disassembler.cpp
# Opt level: O0

string * Disassembler::procObj(string *__return_storage_ptr__,string *hex,int line)

{
  int iVar1;
  allocator local_1d9;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  undefined4 local_114;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0 [8];
  string resp;
  string aux;
  string local_60;
  undefined1 local_40 [8];
  string bin;
  int line_local;
  string *hex_local;
  
  bin.field_2._12_4_ = line;
  std::__cxx11::string::string((string *)&local_60,(string *)hex);
  Conversion::hexToBin((string *)local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::substr((ulong)((long)&resp.field_2 + 8),(ulong)local_40);
  std::__cxx11::string::string(local_b0);
  std::__cxx11::string::string((string *)&local_d0,(string *)(resp.field_2._M_local_buf + 8));
  iVar1 = AsmFuncts::getType(&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  if (iVar1 == 2) {
    std::__cxx11::string::string((string *)&local_110,(string *)local_40);
    iType(&local_f0,&local_110,bin.field_2._12_4_);
    std::__cxx11::string::operator=(local_b0,(string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::string((string *)__return_storage_ptr__,local_b0);
  }
  else {
    std::__cxx11::string::string((string *)&local_138,(string *)(resp.field_2._M_local_buf + 8));
    iVar1 = AsmFuncts::getType(&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    if (iVar1 == 1) {
      std::__cxx11::string::string((string *)&local_178,(string *)local_40);
      rType(&local_158,&local_178);
      std::__cxx11::string::operator=(local_b0,(string *)&local_158);
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::string((string *)__return_storage_ptr__,local_b0);
    }
    else {
      std::__cxx11::string::string((string *)&local_198,(string *)(resp.field_2._M_local_buf + 8));
      iVar1 = AsmFuncts::getType(&local_198);
      std::__cxx11::string::~string((string *)&local_198);
      if (iVar1 == 3) {
        std::__cxx11::string::string((string *)&local_1d8,(string *)local_40);
        jType(&local_1b8,&local_1d8);
        std::__cxx11::string::operator=(local_b0,(string *)&local_1b8);
        std::__cxx11::string::~string((string *)&local_1b8);
        std::__cxx11::string::~string((string *)&local_1d8);
        std::__cxx11::string::string((string *)__return_storage_ptr__,local_b0);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_1d9);
        std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
      }
    }
  }
  local_114 = 1;
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string((string *)(resp.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

string Disassembler::procObj(string hex, int line){
    string bin = Conversion::hexToBin(hex);
    string aux = bin.substr(0,6);
    string resp;
    if(AsmFuncts::getType(aux) == TYPE_I){
        resp = iType(bin, line);
        return resp;
    }
    if(AsmFuncts::getType(aux) == TYPE_R){
        resp = rType(bin);
        return resp;
    }
    if(AsmFuncts::getType(aux) == TYPE_J){
        resp = jType(bin);
        return resp;
    }
    return "";
}